

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_negation_long_Test::TestBody(correctness_negation_long_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  big_integer c;
  string *in_stack_00000158;
  big_integer *in_stack_00000160;
  big_integer a;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  big_integer *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  char *expected_expression;
  int line;
  allocator<char> *file;
  Type in_stack_fffffffffffffe7c;
  allocator<char> *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec8;
  AssertHelper *in_stack_fffffffffffffed0;
  AssertionResult local_e8;
  big_integer *in_stack_ffffffffffffff28;
  string local_d0 [111];
  allocator<char> local_61;
  string local_60 [96];
  
  file = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  big_integer::big_integer(in_stack_00000160,in_stack_00000158);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  expected_expression = &stack0xffffffffffffff2f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  big_integer::big_integer(in_stack_00000160,in_stack_00000158);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
  big_integer::operator-(in_stack_ffffffffffffff28);
  testing::internal::EqHelper<false>::Compare<big_integer,big_integer>
            (expected_expression,
             (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58,
             (big_integer *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  big_integer::~big_integer
            ((big_integer *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffe58 =
         (big_integer *)testing::AssertionResult::failure_message((AssertionResult *)0x121e47);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,(char *)file,
               (int)((ulong)expected_expression >> 0x20),
               (char *)CONCAT17(uVar1,in_stack_fffffffffffffe60));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffed0,(Message *)in_stack_fffffffffffffec8.ptr_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    testing::Message::~Message((Message *)0x121ea4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x121ef9);
  big_integer::operator-(in_stack_ffffffffffffff28);
  testing::internal::EqHelper<false>::Compare<big_integer,big_integer>
            (expected_expression,(char *)CONCAT17(uVar1,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58,
             (big_integer *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  line = (int)((ulong)expected_expression >> 0x20);
  big_integer::~big_integer
            ((big_integer *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  uVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffec0);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80);
    testing::AssertionResult::failure_message((AssertionResult *)0x121fc1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,(char *)file,line
               ,(char *)CONCAT17(uVar1,in_stack_fffffffffffffe60));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffed0,(Message *)in_stack_fffffffffffffec8.ptr_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffe50));
    testing::Message::~Message((Message *)0x12200d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122059);
  big_integer::~big_integer((big_integer *)CONCAT17(uVar2,in_stack_fffffffffffffe50));
  big_integer::~big_integer((big_integer *)CONCAT17(uVar2,in_stack_fffffffffffffe50));
  return;
}

Assistant:

TEST(correctness, negation_long)
{
    big_integer a( "10000000000000000000000000000000000000000000000000000");
    big_integer c("-10000000000000000000000000000000000000000000000000000");

    EXPECT_EQ(-a, c);
    EXPECT_EQ(a, -c);
}